

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O1

Read<int> __thiscall Omega_h::add_each<int>(Omega_h *this,Read<int> *a,Read<int> *b,string *name)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar4;
  size_t sVar5;
  ulong uVar6;
  Read<int> RVar7;
  Write<int> c;
  type f;
  Write<int> local_78;
  Write<int> local_60;
  type local_50;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar6 = pAVar2->size;
  }
  else {
    uVar6 = (ulong)pAVar2 >> 3;
  }
  pAVar3 = (b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar5 = pAVar3->size;
  }
  else {
    sVar5 = (ulong)pAVar3 >> 3;
  }
  if ((int)(uVar6 >> 2) == (int)(sVar5 >> 2)) {
    if (((ulong)pAVar2 & 1) == 0) {
      sVar5 = pAVar2->size;
    }
    else {
      sVar5 = (ulong)pAVar2 >> 3;
    }
    Write<int>::Write(&local_78,(LO)(sVar5 >> 2),name);
    local_50.c.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50.c.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_50.c.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
    local_50.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
    if (((ulong)local_50.a.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50.a.write_.shared_alloc_.alloc =
             (Alloc *)((local_50.a.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_50.a.write_.shared_alloc_.alloc)->use_count =
             (local_50.a.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_50.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
    local_50.b.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
    if (((ulong)local_50.b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_50.b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50.b.write_.shared_alloc_.alloc =
             (Alloc *)((local_50.b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_50.b.write_.shared_alloc_.alloc)->use_count =
             (local_50.b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_50.b.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
    if (((ulong)local_78.shared_alloc_.alloc & 1) == 0) {
      uVar6 = (local_78.shared_alloc_.alloc)->size;
    }
    else {
      uVar6 = (ulong)local_78.shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::add_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_1_>
              ((LO)(uVar6 >> 2),&local_50,"add_each");
    local_60.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
    local_60.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
    if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
         local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
      local_60.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_78.shared_alloc_.alloc = (Alloc *)0x0;
    local_78.shared_alloc_.direct_ptr = (void *)0x0;
    Read<int>::Read((Read<signed_char> *)this,&local_60);
    pAVar2 = local_60.shared_alloc_.alloc;
    if (((ulong)local_60.shared_alloc_.alloc & 7) == 0 &&
        local_60.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_60.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_60.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
      }
    }
    add_each<int>(Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::
    {lambda(int)#1}::~basic_string((_lambda_int__1_ *)&local_50);
    pAVar2 = local_78.shared_alloc_.alloc;
    pvVar4 = extraout_RDX;
    if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
        local_78.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar4 = extraout_RDX_00;
      }
    }
    RVar7.write_.shared_alloc_.direct_ptr = pvVar4;
    RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<int>)RVar7.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0xb6);
}

Assistant:

Read<T> add_each(Read<T> a, Read<T> b, std::string const& name) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<T> c(a.size(), name);
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] + b[i]; };
  parallel_for(c.size(), f, "add_each");
  return c;
}